

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.h
# Opt level: O0

void __thiscall
booster::intrusive_ptr<booster::callable<int_()>_>::~intrusive_ptr
          (intrusive_ptr<booster::callable<int_()>_> *this)

{
  refcounted *in_RDI;
  
  if (in_RDI->_vptr_refcounted != (_func_int **)0x0) {
    intrusive_ptr_release(in_RDI);
  }
  return;
}

Assistant:

~intrusive_ptr()
    {
        if(p_ != 0) intrusive_ptr_release(p_);
    }